

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O0

void __thiscall aalcalc::debug(aalcalc *this,string *subfolder)

{
  FILE *__stream;
  bool bVar1;
  char *__name;
  DIR *__dirp;
  dirent *pdVar2;
  ulong uVar3;
  undefined8 uVar4;
  bool local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108 [39];
  byte local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [39];
  allocator local_b9;
  string local_b8 [8];
  string s;
  dirent *ent;
  DIR *dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  string local_38 [8];
  string path;
  string *subfolder_local;
  aalcalc *this_local;
  
  loadoccurrence(this);
  std::operator+((char *)local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"work/");
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)local_58,(ulong)local_38);
  bVar1 = std::operator!=(local_58,"/");
  std::__cxx11::string::~string((string *)local_58);
  if (bVar1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dir,
                   (char *)local_38);
    std::__cxx11::string::operator=(local_38,(string *)&dir);
    std::__cxx11::string::~string((string *)&dir);
  }
  __name = (char *)std::__cxx11::string::c_str();
  __dirp = opendir(__name);
  __stream = _stderr;
  if (__dirp == (DIR *)0x0) {
    uVar4 = std::__cxx11::string::c_str();
    fprintf(__stream,"FATAL: Unable to open directory %s\n",uVar4);
    exit(-1);
  }
  while (pdVar2 = readdir(__dirp), pdVar2 != (dirent *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,pdVar2->d_name,&local_b9);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    uVar3 = std::__cxx11::string::length();
    local_e1 = 0;
    local_141 = false;
    if (4 < uVar3) {
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)local_e0,(ulong)local_b8);
      local_e1 = 1;
      local_141 = std::operator==(local_e0,".bin");
    }
    if ((local_e1 & 1) != 0) {
      std::__cxx11::string::~string((string *)local_e0);
    }
    if (local_141 != false) {
      std::operator+(local_108,(char *)local_38);
      std::__cxx11::string::operator=(local_b8,(string *)local_108);
      std::__cxx11::string::~string((string *)local_108);
      debug_process_summaryfile(this,(string *)local_b8);
    }
    std::__cxx11::string::~string(local_b8);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void aalcalc::debug(const std::string &subfolder)
{
	loadoccurrence();
	std::string path = "work/" + subfolder;
	if (path.substr(path.length() - 1, 1) != "/") {
		path = path + "/";
	}

	DIR *dir;
	struct dirent *ent;
	if ((dir = opendir(path.c_str())) != NULL) {
		while ((ent = readdir(dir)) != NULL) {
			std::string s = ent->d_name;
			if (s.length() > 4 && s.substr(s.length() - 4, 4) == ".bin") {
				s = path + ent->d_name;
				debug_process_summaryfile(s);
			}
		}
	}
	else {
		fprintf(stderr, "FATAL: Unable to open directory %s\n", path.c_str());
		exit(-1);
	}
}